

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O1

string * __thiscall
flatbuffers::BfbsNamer::Denamespace<reflection::Object_const*>
          (string *__return_storage_ptr__,BfbsNamer *this,Object *t,char delimiter)

{
  ushort uVar1;
  allocator<char> local_41;
  string local_40;
  
  if (*(ushort *)(t + -(long)*(int *)t) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(t + (4 - (long)*(int *)t));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)(t + (ulong)*(uint *)(t + uVar1) + (ulong)uVar1 + 4),
             &local_41);
  Namer::Denamespace(__return_storage_ptr__,&this->super_Namer,&local_40,delimiter);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(T t, const char delimiter = '.') const {
    return Namer::Denamespace(t->name()->c_str(), delimiter);
  }